

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_test_tests.cpp
# Opt level: O0

void __thiscall
test::iu_TypedTest3_x_iutest_x_Mul2_Test<float>::Body
          (iu_TypedTest3_x_iutest_x_Mul2_Test<float> *this)

{
  bool bVar1;
  char *message;
  float *in_R9;
  AssertionHelper local_210;
  Fixed local_1d0;
  float local_44;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  TypeParam_conflict9 x;
  iu_TypedTest3_x_iutest_x_Mul2_Test<float> *this_local;
  
  iutest_ar._36_4_ = 0x3f800000;
  iutest::detail::AlwaysZero();
  local_44 = (float)iutest_ar._36_4_ * 2.0;
  iutest::internal::CmpHelperLT<float,float>
            ((AssertionResult *)local_40,(internal *)0x562658,"2*x",&iutest_ar.field_0x24,&local_44,
             in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
               ,0x4b,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest3, Mul2)
{
    TypeParam x = 1;
    IUTEST_ASSERT_LT(x, 2*x);
}